

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractspinbox.cpp
# Opt level: O0

void __thiscall
QAbstractSpinBox::initStyleOption(QAbstractSpinBox *this,QStyleOptionSpinBox *option)

{
  long lVar1;
  int iVar2;
  QAbstractSpinBoxPrivate *pQVar3;
  QStyle *pQVar4;
  QWidget *in_RSI;
  QStyleOption *in_RDI;
  long in_FS_OFFSET;
  QAbstractSpinBoxPrivate *d;
  SubControl flags;
  enum_type in_stack_ffffffffffffffc0;
  QFlagsStorage<QStyle::SubControl> in_stack_ffffffffffffffc4;
  QStyleOption *this_00;
  QFlagsStorage<QAbstractSpinBox::StepEnabledFlag> local_20;
  undefined4 local_1c;
  undefined4 local_18;
  undefined4 local_14;
  undefined4 local_10;
  undefined4 local_c;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (in_RSI != (QWidget *)0x0) {
    this_00 = in_RDI;
    pQVar3 = d_func((QAbstractSpinBox *)0x68b09f);
    QStyleOption::initFrom(this_00,in_RSI);
    QFlags<QStyle::SubControl>::QFlags
              ((QFlags<QStyle::SubControl> *)
               CONCAT44(in_stack_ffffffffffffffc4.i,in_stack_ffffffffffffffc0),
               (SubControl)((ulong)in_RDI >> 0x20));
    *(undefined4 *)&in_RSI[1].field_0x1c = local_c;
    *(ButtonSymbols *)&in_RSI[1].data = pQVar3->buttonSymbols;
    QFlags<QStyle::SubControl>::QFlags
              ((QFlags<QStyle::SubControl> *)
               CONCAT44(in_stack_ffffffffffffffc4.i,in_stack_ffffffffffffffc0),
               (SubControl)((ulong)in_RDI >> 0x20));
    *(undefined4 *)&in_RSI[1].field_0x18 = local_10;
    pQVar4 = QWidget::style((QWidget *)in_RDI);
    iVar2 = (**(code **)(*(long *)pQVar4 + 0xf0))(pQVar4,0x73,0,in_RDI);
    if (iVar2 != 0) {
      QFlags<QStyle::SubControl>::operator|=
                ((QFlags<QStyle::SubControl> *)&in_RSI[1].field_0x18,SC_ComboBoxArrow);
    }
    if (pQVar3->buttonSymbols != NoButtons) {
      in_stack_ffffffffffffffc4.i =
           (Int)::operator|(in_stack_ffffffffffffffc4.i,in_stack_ffffffffffffffc0);
      QFlags<QStyle::SubControl>::operator|=
                ((QFlags<QStyle::SubControl> *)&in_RSI[1].field_0x18,
                 (QFlags<QStyle::SubControl>)in_stack_ffffffffffffffc4.i);
      flags = (SubControl)((ulong)in_RDI >> 0x20);
      if ((pQVar3->buttonState & 0x10) == 0) {
        if ((pQVar3->buttonState & 0x20) != 0) {
          QFlags<QStyle::SubControl>::QFlags
                    ((QFlags<QStyle::SubControl> *)
                     CONCAT44(in_stack_ffffffffffffffc4.i,in_stack_ffffffffffffffc0),flags);
          *(undefined4 *)&in_RSI[1].field_0x1c = local_18;
        }
      }
      else {
        QFlags<QStyle::SubControl>::QFlags
                  ((QFlags<QStyle::SubControl> *)
                   CONCAT44(in_stack_ffffffffffffffc4.i,in_stack_ffffffffffffffc0),flags);
        *(undefined4 *)&in_RSI[1].field_0x1c = local_14;
      }
    }
    if (pQVar3->buttonState == 0) {
      QFlags<QStyle::SubControl>::QFlags
                ((QFlags<QStyle::SubControl> *)
                 CONCAT44(in_stack_ffffffffffffffc4.i,in_stack_ffffffffffffffc0),
                 (SubControl)((ulong)in_RDI >> 0x20));
      *(undefined4 *)&in_RSI[1].field_0x1c = local_1c;
    }
    else {
      QFlags<QStyle::StateFlag>::operator|=
                ((QFlags<QStyle::StateFlag> *)&in_RSI->field_0x8,State_Sunken);
    }
    pQVar4 = QWidget::style((QWidget *)in_RDI);
    iVar2 = (**(code **)(*(long *)pQVar4 + 0xf0))(pQVar4,0x38,0,in_RDI);
    if (iVar2 == 0) {
      local_20.i = (Int)::operator|(in_stack_ffffffffffffffc4.i,in_stack_ffffffffffffffc0);
    }
    else {
      local_20.i = (**(code **)(*(long *)in_RDI + 0x1c8))();
    }
    ((QFlagsStorage<QAbstractSpinBox::StepEnabledFlag> *)((long)&in_RSI[1].data + 4))->i =
         local_20.i;
    in_RSI[2].super_QObject = (QObject)((*(ushort *)&pQVar3->field_0x3d0 >> 4 & 1) != 0);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QAbstractSpinBox::initStyleOption(QStyleOptionSpinBox *option) const
{
    if (!option)
        return;

    Q_D(const QAbstractSpinBox);
    option->initFrom(this);
    option->activeSubControls = QStyle::SC_None;
    option->buttonSymbols = d->buttonSymbols;
    option->subControls = QStyle::SC_SpinBoxEditField;
    if (style()->styleHint(QStyle::SH_SpinBox_ButtonsInsideFrame, nullptr, this))
        option->subControls |= QStyle::SC_SpinBoxFrame;
    if (d->buttonSymbols != QAbstractSpinBox::NoButtons) {
        option->subControls |= QStyle::SC_SpinBoxUp | QStyle::SC_SpinBoxDown;
        if (d->buttonState & Up) {
            option->activeSubControls = QStyle::SC_SpinBoxUp;
        } else if (d->buttonState & Down) {
            option->activeSubControls = QStyle::SC_SpinBoxDown;
        }
    }

    if (d->buttonState) {
        option->state |= QStyle::State_Sunken;
    } else {
        option->activeSubControls = d->hoverControl;
    }

    option->stepEnabled = style()->styleHint(QStyle::SH_SpinControls_DisableOnBounds, nullptr, this)
                      ? stepEnabled()
                      : (QAbstractSpinBox::StepDownEnabled|QAbstractSpinBox::StepUpEnabled);

    option->frame = d->frame;
}